

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

int Gia_ManAreDeriveNexts(Gia_ManAre_t *p,Gia_PtrAre_t Sta)

{
  int iVar1;
  undefined8 uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  Gia_Man_t *pGVar10;
  Gia_Obj_t *pGVar11;
  uint *puVar12;
  uint uVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  Gia_Obj_t *pGVar19;
  timespec ts;
  timespec local_60;
  long local_50;
  long local_48;
  Gia_ManAre_t *local_40;
  size_t local_38;
  
  iVar6 = clock_gettime(3,&local_60);
  if (iVar6 < 0) {
    iVar6 = 1;
  }
  else {
    iVar6 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8) >> 7) -
            (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),0xc) >> 0x1f)) +
            (int)local_60.tv_sec * -1000000;
  }
  local_48 = *(long *)((long)p->ppStas + (ulong)((uint)Sta >> 0x11 & 0x3ff8));
  local_50 = (long)p->nSize * (ulong)((uint)Sta & 0xfffff);
  if (*(int *)(local_48 + local_50 * 4) < 0) {
    iVar8 = 0;
  }
  else {
    pGVar10 = p->pNew;
    if ((pGVar10 != (Gia_Man_t *)0x0) && (1000000 < pGVar10->nObjs)) {
      Gia_ManStop(pGVar10);
      p->pNew = (Gia_Man_t *)0x0;
    }
    if (p->pNew == (Gia_Man_t *)0x0) {
      pGVar10 = Gia_ManStart(p->pAig->nObjs * 10);
      p->pNew = pGVar10;
      Gia_ManIncrementTravId(pGVar10);
      Gia_ManHashAlloc(p->pNew);
      pGVar10 = p->pAig;
      pGVar10->pObjs->Value = 0;
      pVVar14 = pGVar10->vCis;
      if (0 < pVVar14->nSize) {
        lVar18 = 0;
        local_40 = p;
        do {
          iVar8 = pVVar14->pArray[lVar18];
          if (((long)iVar8 < 0) || (pGVar10->nObjs <= iVar8)) goto LAB_0072ce72;
          pGVar19 = pGVar10->pObjs;
          if (pGVar19 == (Gia_Obj_t *)0x0) break;
          pGVar10 = p->pNew;
          uVar7 = pGVar10->nObjs;
          uVar15 = pGVar10->nObjsAlloc;
          if (uVar7 == uVar15) {
            uVar13 = uVar15 * 2;
            if (0x1fffffff < (int)(uVar15 * 2)) {
              uVar13 = 0x20000000;
            }
            if (uVar7 == 0x20000000) {
              puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
              exit(1);
            }
            if ((int)uVar13 <= (int)uVar7) {
              __assert_fail("p->nObjs < nObjNew",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x288,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
            }
            if (pGVar10->fVerbose != 0) {
              printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar15,(ulong)uVar13);
            }
            if (pGVar10->nObjsAlloc < 1) {
              __assert_fail("p->nObjsAlloc > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x28b,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
            }
            lVar16 = (long)(int)uVar13;
            local_38 = lVar16 * 4;
            if (pGVar10->pObjs == (Gia_Obj_t *)0x0) {
              pGVar11 = (Gia_Obj_t *)malloc(lVar16 * 0xc);
            }
            else {
              pGVar11 = (Gia_Obj_t *)realloc(pGVar10->pObjs,lVar16 * 0xc);
            }
            pGVar10->pObjs = pGVar11;
            memset(pGVar11 + pGVar10->nObjsAlloc,0,(lVar16 - pGVar10->nObjsAlloc) * 0xc);
            if (pGVar10->pMuxes != (uint *)0x0) {
              puVar12 = (uint *)realloc(pGVar10->pMuxes,local_38);
              pGVar10->pMuxes = puVar12;
              memset(puVar12 + pGVar10->nObjsAlloc,0,(lVar16 - pGVar10->nObjsAlloc) * 4);
            }
            pGVar10->nObjsAlloc = uVar13;
            p = local_40;
          }
          if ((pGVar10->vHTable).nSize != 0) {
            Vec_IntPush(&pGVar10->vHash,0);
          }
          iVar9 = pGVar10->nObjs;
          pGVar10->nObjs = iVar9 + 1;
          if ((long)iVar9 < 0) goto LAB_0072ce72;
          pGVar11 = pGVar10->pObjs + iVar9;
          uVar17 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar17 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar17 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(pGVar10->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = pGVar10->pObjs;
          if ((pGVar11 < pGVar5) || (pGVar5 + pGVar10->nObjs <= pGVar11)) {
LAB_0072ceb0:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(pGVar10->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555)
          ;
          pGVar5 = pGVar10->pObjs;
          if ((pGVar11 < pGVar5) || (pGVar5 + pGVar10->nObjs <= pGVar11)) goto LAB_0072ceb0;
          pGVar19[iVar8].Value = (int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * 0x55555556;
          lVar18 = lVar18 + 1;
          pGVar10 = p->pAig;
          pVVar14 = pGVar10->vCis;
        } while (lVar18 < pVVar14->nSize);
      }
    }
    pGVar10 = p->pAig;
    iVar8 = pGVar10->nRegs;
    if (0 < (long)iVar8) {
      pVVar14 = pGVar10->vCis;
      iVar9 = pVVar14->nSize;
      uVar17 = (ulong)(uint)(iVar9 - iVar8);
      lVar18 = 0;
      do {
        if (((int)uVar17 < 0) || (iVar9 <= (int)uVar17)) {
LAB_0072cecf:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pVVar14->pArray[uVar17];
        if (((long)iVar1 < 0) || (pGVar10->nObjs <= iVar1)) goto LAB_0072ce72;
        if (pGVar10->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar19 = pGVar10->pObjs + iVar1;
        uVar7 = *(uint *)(local_48 + local_50 * 4 + 8 + (long)((int)(uint)lVar18 >> 5) * 4);
        uVar13 = (uint)lVar18 & 0x1e;
        uVar15 = 0;
        if (((uVar7 >> uVar13 & 1) == 0) && (uVar15 = 1, (uVar7 >> (sbyte)uVar13 & 2) == 0)) {
          uVar2 = *(undefined8 *)pGVar19;
          if (-1 < (int)uVar2) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          uVar7 = (uint)((ulong)uVar2 >> 0x20);
          pVVar3 = p->pNew->vCis;
          if (pVVar3->nSize <= (int)(uVar7 & 0x1fffffff)) goto LAB_0072cecf;
          iVar1 = pVVar3->pArray[uVar7 & 0x1fffffff];
          if ((iVar1 < 0) || (p->pNew->nObjs <= iVar1)) goto LAB_0072ce72;
          uVar15 = iVar1 * 2;
        }
        pGVar19->Value = uVar15;
        uVar17 = uVar17 + 1;
        lVar18 = lVar18 + 2;
      } while ((long)iVar8 * 2 != lVar18);
    }
    pGVar10 = p->pAig;
    iVar8 = pGVar10->nObjs;
    if ((0 < iVar8) && (pGVar19 = pGVar10->pObjs, pGVar19 != (Gia_Obj_t *)0x0)) {
      lVar18 = 0;
      do {
        uVar17 = *(ulong *)pGVar19;
        if ((uVar17 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar17) {
          if ((int)pGVar19[-(uVar17 & 0x1fffffff)].Value < 0) goto LAB_0072ce91;
          uVar7 = (uint)(uVar17 >> 0x20);
          if ((int)pGVar19[-(ulong)(uVar7 & 0x1fffffff)].Value < 0) goto LAB_0072ce91;
          uVar7 = Gia_ManHashAnd(p->pNew,pGVar19[-(uVar17 & 0x1fffffff)].Value ^
                                         (uint)(uVar17 >> 0x1d) & 1,
                                 pGVar19[-(ulong)(uVar7 & 0x1fffffff)].Value ^ uVar7 >> 0x1d & 1);
          pGVar19->Value = uVar7;
        }
        lVar18 = lVar18 + 1;
        pGVar10 = p->pAig;
        iVar8 = pGVar10->nObjs;
      } while ((lVar18 < iVar8) &&
              (pGVar19 = pGVar10->pObjs + lVar18, pGVar10->pObjs != (Gia_Obj_t *)0x0));
    }
    lVar18 = (long)pGVar10->vCos->nSize;
    if (0 < lVar18) {
      piVar4 = pGVar10->vCos->pArray;
      lVar16 = 0;
      do {
        iVar9 = piVar4[lVar16];
        if (((long)iVar9 < 0) || (iVar8 <= iVar9)) {
LAB_0072ce72:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGVar10->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar19 = pGVar10->pObjs + iVar9;
        if ((int)pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].Value < 0) {
LAB_0072ce91:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        pGVar19->Value =
             (uint)*(undefined8 *)pGVar19 >> 0x1d & 1 ^
             pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].Value;
        lVar16 = lVar16 + 1;
      } while (lVar18 != lVar16);
    }
    p->nRecCalls = 0;
    iVar8 = Gia_ManAreDeriveNexts_rec(p,Sta);
    if (999999 < p->nRecCalls) {
      printf("Exceeded the limit on the number of transitions from a state cube (%d).\n",1000000);
      p->fStopped = 1;
    }
    iVar9 = clock_gettime(3,&local_60);
    if (iVar9 < 0) {
      iVar9 = -1;
    }
    else {
      iVar9 = (int)(local_60.tv_nsec / 1000) + (int)local_60.tv_sec * 1000000;
    }
    p->timeAig = p->timeAig + iVar9 + iVar6;
  }
  return iVar8;
}

Assistant:

int Gia_ManAreDeriveNexts( Gia_ManAre_t * p, Gia_PtrAre_t Sta )
{
    Gia_StaAre_t * pSta;
    Gia_Obj_t * pObj;
    int i, RetValue;
    abctime clk = Abc_Clock();
    pSta = Gia_ManAreSta( p, Sta );
    if ( Gia_StaIsUnused(pSta) )
        return 0;
    // recycle the manager
    if ( p->pNew && Gia_ManObjNum(p->pNew) > 1000000 )
    {
        Gia_ManStop( p->pNew );
        p->pNew = NULL;
    }
    // allocate the manager
    if ( p->pNew == NULL )
    {
        p->pNew = Gia_ManStart( 10 * Gia_ManObjNum(p->pAig) );
        Gia_ManIncrementTravId( p->pNew );
        Gia_ManHashAlloc( p->pNew );
        Gia_ManConst0(p->pAig)->Value = 0;
        Gia_ManForEachCi( p->pAig, pObj, i )
            pObj->Value = Gia_ManAppendCi(p->pNew);
    }
    Gia_ManForEachRo( p->pAig, pObj, i )
    {
        if ( Gia_StaHasValue0( pSta, i ) )
            pObj->Value = 0;
        else if ( Gia_StaHasValue1( pSta, i ) )
            pObj->Value = 1;
        else // don't-care literal
            pObj->Value = Abc_Var2Lit( Gia_ObjId( p->pNew, Gia_ManCi(p->pNew, Gia_ObjCioId(pObj)) ), 0 );
    }
    Gia_ManForEachAnd( p->pAig, pObj, i )
        pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p->pAig, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);

    // perform case-splitting
    p->nRecCalls = 0;
    RetValue = Gia_ManAreDeriveNexts_rec( p, Sta );
    if ( p->nRecCalls >= MAX_CALL_NUM )
    {
        printf( "Exceeded the limit on the number of transitions from a state cube (%d).\n", MAX_CALL_NUM );
        p->fStopped = 1;
    }
//    printf( "%d ", p->nRecCalls );
//printf( "%d ", Gia_ManObjNum(p->pNew) );
    p->timeAig += Abc_Clock() - clk;
    return RetValue;
}